

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O1

bool __thiscall
ssl_credential_st::AppendIntermediateCert(ssl_credential_st *this,UniquePtr<CRYPTO_BUFFER> *cert)

{
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *this_00;
  OPENSSL_STACK *sk;
  __uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> __p;
  size_t sVar1;
  bool bVar2;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_28;
  __uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> local_20;
  
  if (this->type < kSPAKE2PlusV1Client) {
    this_00 = &this->chain;
    if ((this->chain)._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
        _M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl ==
        (stack_st_CRYPTO_BUFFER *)0x0) {
      bssl::new_leafless_chain();
      __p._M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
           local_20._M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
      local_20._M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
           (tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)
           (_Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)0x0;
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)this_00,
                 (pointer)__p._M_t.
                          super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl);
      std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&local_20);
      if ((this_00->_M_t).super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
          _M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl ==
          (stack_st_CRYPTO_BUFFER *)0x0) {
        return false;
      }
    }
    sk = (OPENSSL_STACK *)
         (this_00->_M_t).super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t
         .super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    local_28._M_head_impl =
         (cert->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
    (cert->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl = (crypto_buffer_st *)0x0;
    sVar1 = OPENSSL_sk_push(sk,local_28._M_head_impl);
    bVar2 = sVar1 != 0;
    if (bVar2) {
      local_28._M_head_impl = (crypto_buffer_st *)0x0;
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_28);
  }
  else {
    if (1 < this->type - kSPAKE2PlusV1Client) {
      abort();
    }
    bVar2 = false;
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x13c);
  }
  return bVar2;
}

Assistant:

bool ssl_credential_st::UsesX509() const {
  switch (type) {
    case SSLCredentialType::kX509:
    case SSLCredentialType::kDelegated:
      return true;
    case SSLCredentialType::kSPAKE2PlusV1Client:
    case SSLCredentialType::kSPAKE2PlusV1Server:
      return false;
  }
  abort();
}